

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char16_t>::operator()
          (default_arg_formatter<char16_t> *this,longdouble value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  longdouble value_local;
  default_arg_formatter<char16_t> *this_local;
  
  bVar1 = write<char16_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_long_double,_0>
                    ((this->out).container,value);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }